

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef rec_cat(jit_State *J,BCReg baseslot,BCReg topslot)

{
  undefined8 *puVar1;
  int iVar2;
  int in_EDX;
  long in_RDI;
  int errcode;
  RecCatDataCP rcd;
  TValue errobj;
  ptrdiff_t delta;
  lua_State *L;
  undefined1 local_d0 [52];
  int local_9c;
  TRef local_98;
  undefined8 local_90;
  long local_88;
  long local_80;
  TRef local_64;
  undefined8 *local_48;
  undefined8 *local_40;
  long local_38;
  char *local_30;
  undefined8 *local_28;
  long local_20;
  
  local_80 = *(long *)(in_RDI + 0x68);
  local_88 = *(long *)(local_80 + 0x18) - *(long *)(local_80 + 0x10) >> 3;
  local_9c = in_EDX;
  memcpy(local_d0,(void *)(*(long *)(local_80 + 0x10) + (ulong)(in_EDX - 1) * 8),0x28);
  iVar2 = lj_vm_cpcall(local_80,0,local_d0,rec_mm_concat_cp);
  if (iVar2 != 0) {
    local_48 = (undefined8 *)(*(long *)(local_80 + 0x18) + -8);
    local_38 = local_80;
    local_40 = &local_90;
    local_90 = *local_48;
    local_20 = local_80;
    local_30 = "copy of dead GC object";
    local_28 = local_40;
  }
  memcpy((void *)(*(long *)(local_80 + 0x10) + (ulong)(local_9c - 1) * 8),local_d0,0x28);
  if (iVar2 == 0) {
    local_64 = local_98;
  }
  else {
    *(long *)(local_80 + 0x18) = *(long *)(local_80 + 0x10) + local_88 * 8;
    puVar1 = *(undefined8 **)(local_80 + 0x18);
    *(undefined8 **)(local_80 + 0x18) = puVar1 + 1;
    *puVar1 = local_90;
    local_64 = -iVar2;
  }
  return local_64;
}

Assistant:

static TRef rec_cat(jit_State *J, BCReg baseslot, BCReg topslot)
{
  lua_State *L = J->L;
  ptrdiff_t delta = L->top - L->base;
  TValue errobj;
  RecCatDataCP rcd;
  int errcode;
  rcd.J = J;
  rcd.baseslot = baseslot;
  rcd.topslot = topslot;
  /* Save slots. */
  memcpy(rcd.savetv, &L->base[topslot-1], sizeof(rcd.savetv));
  errcode = lj_vm_cpcall(L, NULL, &rcd, rec_mm_concat_cp);
  if (errcode) copyTV(L, &errobj, L->top-1);
  /* Restore slots. */
  memcpy(&L->base[rcd.topslot-1], rcd.savetv, sizeof(rcd.savetv));
  if (errcode) {
    L->top = L->base + delta;
    copyTV(L, L->top++, &errobj);
    return (TRef)(-errcode);
  }
  return rcd.tr;
}